

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<long_double>::PrepareZ
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,
          longdouble beta,int opt)

{
  int64_t iVar1;
  longdouble *plVar2;
  int in_ECX;
  TPZFMatrix<long_double> *in_RDX;
  TPZFMatrix<long_double> *in_RSI;
  TPZBaseMatrix *in_RDI;
  longdouble in_stack_00000008;
  int64_t i;
  longdouble *yp;
  longdouble *zlast;
  longdouble *zp;
  int64_t ic;
  int64_t xcols;
  int64_t numeq;
  long local_78;
  long in_stack_ffffffffffffff98;
  TPZFMatrix<long_double> *in_stack_ffffffffffffffa0;
  longdouble *local_50;
  long local_48;
  
  if (in_ECX == 0) {
    local_78 = TPZBaseMatrix::Rows(in_RDI);
  }
  else {
    local_78 = TPZBaseMatrix::Cols(in_RDI);
  }
  iVar1 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  (*(in_RDX->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(in_RDX,local_78,iVar1);
  for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
    local_50 = TPZFMatrix<long_double>::operator()
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(int64_t)in_RDI);
    plVar2 = local_50 + local_78;
    if ((in_stack_00000008 != (longdouble)0) || (NAN(in_stack_00000008) || NAN((longdouble)0))) {
      in_stack_ffffffffffffffa0 =
           (TPZFMatrix<long_double> *)TPZFMatrix<long_double>::g(in_RSI,0,local_48);
      if (in_RDX != in_RSI) {
        memcpy(local_50,in_stack_ffffffffffffffa0,local_78 << 4);
      }
      for (in_stack_ffffffffffffff98 = 0; in_stack_ffffffffffffff98 < local_78;
          in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + 1) {
        plVar2 = TPZFMatrix<long_double>::operator()
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(int64_t)in_RDI);
        *plVar2 = *plVar2 * in_stack_00000008;
      }
    }
    else {
      for (; local_50 != plVar2; local_50 = local_50 + 1) {
        *local_50 = (longdouble)0;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}